

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_structurizer.cpp
# Opt level: O0

CFGNode * dxil_spv::CFGStructurizer::scan_plain_continue_block(CFGNode *node)

{
  bool bVar1;
  bool bVar2;
  CFGNode *base_node;
  CFGNode *node_local;
  
  base_node = node;
  while( true ) {
    bVar1 = block_is_plain_continue(base_node);
    bVar2 = false;
    if (!bVar1) {
      bVar1 = CFGNode::dominates(node,base_node);
      bVar2 = false;
      if ((((bVar1) && (bVar2 = false, base_node->succ_back_edge == (CFGNode *)0x0)) &&
          (bVar2 = false, base_node->pred_back_edge == (CFGNode *)0x0)) &&
         (bVar2 = false, base_node->immediate_post_dominator != (CFGNode *)0x0)) {
        bVar2 = base_node->immediate_post_dominator != base_node;
      }
    }
    if (!bVar2) break;
    base_node = base_node->immediate_post_dominator;
  }
  return base_node;
}

Assistant:

const CFGNode *CFGStructurizer::scan_plain_continue_block(const CFGNode *node)
{
	auto *base_node = node;
	while (!block_is_plain_continue(node) &&
	       base_node->dominates(node) &&
	       !node->succ_back_edge &&
	       !node->pred_back_edge &&
	       node->immediate_post_dominator &&
	       node->immediate_post_dominator != node)
	{
		node = node->immediate_post_dominator;
	}

	return node;
}